

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O2

int TVMArrayCopyFromBytes(TVMArrayHandle handle,void *data,size_t nbytes)

{
  TVMContext ctx;
  ostream *poVar1;
  DeviceAPI *pDVar2;
  LogCheckError _check_err;
  size_t arr_size;
  LogCheckError local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  LogMessageFatal local_1a0;
  
  local_1b0 = nbytes;
  local_1a8 = tvm::runtime::GetDataSize(handle);
  dmlc::LogCheck_EQ<unsigned_long,unsigned_long>((dmlc *)&local_1b8,&local_1a8,&local_1b0);
  if (local_1b8.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/ndarray.cc"
               ,0x101);
    poVar1 = std::operator<<((ostream *)&local_1a0,"Check failed: ");
    poVar1 = std::operator<<(poVar1,"arr_size == nbytes");
    poVar1 = std::operator<<(poVar1,(string *)local_1b8.str);
    poVar1 = std::operator<<(poVar1,": ");
    std::operator<<(poVar1,"TVMArrayCopyFromBytes: size mismatch");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  dmlc::LogCheckError::~LogCheckError(&local_1b8);
  ctx.device_type = (handle->ctx).device_type;
  ctx.device_id = (handle->ctx).device_id;
  pDVar2 = tvm::runtime::DeviceAPI::Get(ctx,false);
  (*pDVar2->_vptr_DeviceAPI[6])
            (pDVar2,data,0,handle->data,handle->byte_offset,local_1b0,1,handle->ctx,handle->dtype,0)
  ;
  return 0;
}

Assistant:

int TVMArrayCopyFromBytes(TVMArrayHandle handle,
                          void *data,
                          size_t nbytes) {
  API_BEGIN();
  TVMContext cpu_ctx;
  cpu_ctx.device_type = kDLCPU;
  cpu_ctx.device_id = 0;
  size_t arr_size = GetDataSize(*handle);
  CHECK_EQ(arr_size, nbytes)
      << "TVMArrayCopyFromBytes: size mismatch";
  DeviceAPI::Get(handle->ctx)->CopyDataFromTo(data, 0, handle->data, static_cast<size_t>(handle->byte_offset), nbytes, cpu_ctx, handle->ctx, handle->dtype, nullptr);
  API_END();
}